

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O0

ostream * jsonnet::internal::operator<<(ostream *o,StaticError *err)

{
  ostream *in_RDI;
  StaticError *in_stack_00000168;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  StaticError::toString_abi_cxx11_(in_stack_00000168);
  std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const StaticError &err)
{
    o << err.toString();
    return o;
}